

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageLayout.cpp
# Opt level: O3

void __thiscall KDReports::Test::testEndlessPrinterBug(Test *this)

{
  char *__s;
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  size_t sVar7;
  size_t len;
  long lVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QSqlTableModel tableModel;
  AutoTableElement tableElement;
  QSqlDatabase db;
  QSqlQuery query;
  Report report;
  QArrayDataPointer<char16_t> local_c8;
  undefined1 local_a8 [16];
  QArrayDataPointer<char16_t> local_98;
  undefined1 local_78 [8];
  undefined1 local_70 [8];
  QArrayDataPointer<char16_t> local_68;
  char *local_50;
  Report local_48 [24];
  
  KDReports::Report::Report(local_48,(QObject *)0x0);
  local_a8._0_8_ = "QSQLITE";
  QByteArrayView::QByteArrayView<const_char_*,_true>
            ((QByteArrayView *)(local_70 + 8),(char **)local_a8);
  QVar9.m_data = (storage_type *)local_68.d;
  QVar9.m_size = (qsizetype)(local_a8 + 0x10);
  QString::fromUtf8(QVar9);
  pcVar2 = local_98.ptr;
  pDVar1 = local_98.d;
  local_98.d = (Data *)0x0;
  local_98.ptr = (char16_t *)0x0;
  local_c8.d._0_4_ = SUB84(pDVar1,0);
  local_c8.d._4_2_ = (undefined2)((ulong)pDVar1 >> 0x20);
  local_c8.d._6_2_ = (undefined2)((ulong)pDVar1 >> 0x30);
  local_c8.ptr._0_6_ = SUB86(pcVar2,0);
  local_c8.ptr._6_2_ = (undefined2)((ulong)pcVar2 >> 0x30);
  local_c8.size = local_98.size;
  local_98.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)(local_a8 + 0x10));
  __s = QSqlDatabase::defaultConnection;
  if (QSqlDatabase::defaultConnection == (char *)0x0) {
    sVar7 = 0;
  }
  else {
    sVar7 = strlen(QSqlDatabase::defaultConnection);
  }
  len = sVar7;
  if ((long)sVar7 < 1) {
    len = 0;
  }
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_68.size = 0;
  if (__s == (char *)0x0) {
    len = 0;
  }
  if (__s != (char *)0x0 && (long)sVar7 < 0) {
    len = strlen(__s);
  }
  QByteArrayView::QByteArrayView<char,_true>((QByteArrayView *)local_a8,__s,len);
  QVar10.m_data = (storage_type *)local_a8._0_8_;
  QVar10.m_size = (qsizetype)(local_a8 + 0x10);
  QString::fromLatin1(QVar10);
  qVar3 = local_68.size;
  pcVar2 = local_68.ptr;
  pDVar1 = local_68.d;
  local_68.d = local_98.d;
  local_68.ptr = local_98.ptr;
  local_98.d = pDVar1;
  local_98.ptr = pcVar2;
  local_68.size = local_98.size;
  local_98.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)(local_a8 + 0x10));
  QSqlDatabase::addDatabase((QString *)local_78,(QString *)&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)(local_70 + 8));
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  local_a8._0_8_ = ":memory:";
  QByteArrayView::QByteArrayView<const_char_*,_true>
            ((QByteArrayView *)(local_70 + 8),(char **)local_a8);
  QVar11.m_data = (storage_type *)local_68.d;
  QVar11.m_size = (qsizetype)(local_a8 + 0x10);
  QString::fromUtf8(QVar11);
  pcVar2 = local_98.ptr;
  pDVar1 = local_98.d;
  local_98.d = (Data *)0x0;
  local_98.ptr = (char16_t *)0x0;
  local_c8.d._0_4_ = SUB84(pDVar1,0);
  local_c8.d._4_2_ = (undefined2)((ulong)pDVar1 >> 0x20);
  local_c8.d._6_2_ = (undefined2)((ulong)pDVar1 >> 0x30);
  local_c8.ptr._0_6_ = SUB86(pcVar2,0);
  local_c8.ptr._6_2_ = (undefined2)((ulong)pcVar2 >> 0x30);
  local_c8.size = local_98.size;
  local_98.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)(local_a8 + 0x10));
  QSqlDatabase::setDatabaseName((QString *)local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  bVar4 = (bool)QSqlDatabase::open();
  cVar5 = QTest::qVerify(bVar4,"db.open()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/PageLayout/PageLayout.cpp"
                         ,0x73);
  if (cVar5 != '\0') {
    local_98.d = (Data *)0x0;
    local_98.ptr = (char16_t *)0x0;
    local_98.size = 0;
    QSqlDatabase::QSqlDatabase((QSqlDatabase *)&local_c8);
    QSqlQuery::QSqlQuery
              ((QSqlQuery *)local_70,(QString *)(local_a8 + 0x10),(QSqlDatabase *)&local_c8);
    QSqlDatabase::~QSqlDatabase((QSqlDatabase *)&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)(local_a8 + 0x10));
    local_a8._0_8_ =
         "create table airlines (id int primary key, name varchar(20), homecountry varchar(2))";
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)(local_70 + 8),(char **)local_a8);
    QVar12.m_data = (storage_type *)local_68.d;
    QVar12.m_size = (qsizetype)(local_a8 + 0x10);
    QString::fromUtf8(QVar12);
    pcVar2 = local_98.ptr;
    pDVar1 = local_98.d;
    local_98.d = (Data *)0x0;
    local_98.ptr = (char16_t *)0x0;
    local_c8.d._0_4_ = SUB84(pDVar1,0);
    local_c8.d._4_2_ = (undefined2)((ulong)pDVar1 >> 0x20);
    local_c8.d._6_2_ = (undefined2)((ulong)pDVar1 >> 0x30);
    local_c8.ptr._0_6_ = SUB86(pcVar2,0);
    local_c8.ptr._6_2_ = (undefined2)((ulong)pcVar2 >> 0x30);
    local_c8.size = local_98.size;
    local_98.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)(local_a8 + 0x10));
    QSqlQuery::exec((QString *)local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
    lVar8 = 0;
    do {
      local_50 = "insert into airlines values(%0, \'Test%0\', \'T%0\')";
      QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)local_a8,&local_50);
      QVar13.m_data = (storage_type *)local_a8._0_8_;
      QVar13.m_size = (qsizetype)(local_a8 + 0x10);
      QString::fromUtf8(QVar13);
      local_68.ptr = local_98.ptr;
      local_68.d = local_98.d;
      local_98.d = (Data *)0x0;
      local_98.ptr = (char16_t *)0x0;
      local_68.size = local_98.size;
      local_98.size = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)(local_a8 + 0x10));
      QString::arg((longlong)&local_c8,(int)(QArrayDataPointer<char16_t> *)(local_70 + 8),(int)lVar8
                   ,(QChar)0x0);
      QSqlQuery::exec((QString *)local_70);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)(local_70 + 8))
      ;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 500);
    QSqlTableModel::QSqlTableModel
              ((QSqlTableModel *)local_a8,(QObject *)0x0,(QSqlDatabase *)local_78);
    local_50 = "airlines";
    QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)(local_70 + 8),&local_50);
    QVar14.m_data = (storage_type *)local_68.d;
    QVar14.m_size = (qsizetype)(local_a8 + 0x10);
    QString::fromUtf8(QVar14);
    pcVar2 = local_98.ptr;
    pDVar1 = local_98.d;
    local_98.d = (Data *)0x0;
    local_98.ptr = (char16_t *)0x0;
    local_c8.d._0_4_ = SUB84(pDVar1,0);
    local_c8.d._4_2_ = (undefined2)((ulong)pDVar1 >> 0x20);
    local_c8.d._6_2_ = (undefined2)((ulong)pDVar1 >> 0x30);
    local_c8.ptr._0_6_ = SUB86(pcVar2,0);
    local_c8.ptr._6_2_ = (undefined2)((ulong)pcVar2 >> 0x30);
    local_c8.size = local_98.size;
    local_98.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)(local_a8 + 0x10));
    QSqlTableModel::setTable((QString *)local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
    QSqlTableModel::select();
    KDReports::AutoTableElement::AutoTableElement
              ((AutoTableElement *)(local_a8 + 0x10),(QAbstractItemModel *)local_a8);
    KDReports::AutoTableElement::setVerticalHeaderVisible((bool)((char)local_a8 + '\x10'));
    local_c8.d._0_4_ = 0;
    local_c8.d._4_2_ = 0xffff;
    local_c8.d._6_2_ = 0;
    local_c8.ptr._0_6_ = 0;
    KDReports::Report::addElement(local_48,local_a8 + 0x10,1);
    KDReports::Report::setWidthForEndlessPrinter(105.0);
    iVar6 = KDReports::Report::numberOfPages();
    QTest::qCompare(iVar6,1,"report.numberOfPages()","1",
                    "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/PageLayout/PageLayout.cpp"
                    ,0x86);
    KDReports::AutoTableElement::~AutoTableElement((AutoTableElement *)(local_a8 + 0x10));
    QSqlTableModel::~QSqlTableModel((QSqlTableModel *)local_a8);
    QSqlQuery::~QSqlQuery((QSqlQuery *)local_70);
  }
  QSqlDatabase::~QSqlDatabase((QSqlDatabase *)local_78);
  KDReports::Report::~Report(local_48);
  return;
}

Assistant:

void testEndlessPrinterBug()
    {
        KDReports::Report report;
        QSqlDatabase db = QSqlDatabase::addDatabase("QSQLITE");
        db.setDatabaseName(":memory:");
        QVERIFY(db.open());

        // fill the DB with some test data
        QSqlQuery query;
        query.exec("create table airlines (id int primary key, "
                   "name varchar(20), homecountry varchar(2))");
        for (int i = 0; i < 500; i++)
            query.exec(QString("insert into airlines values(%0, 'Test%0', 'T%0')").arg(i));

        QSqlTableModel tableModel(nullptr, db);
        tableModel.setTable("airlines");
        tableModel.select();

        KDReports::AutoTableElement tableElement(&tableModel);
        tableElement.setVerticalHeaderVisible(false);
        report.addElement(tableElement);

        report.setWidthForEndlessPrinter(105.0);

        QCOMPARE(report.numberOfPages(), 1);
    }